

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int verify_finished(ptls_t *tls,ptls_iovec_t message)

{
  int iVar1;
  int local_6c;
  undefined1 local_68 [4];
  int ret;
  uint8_t verify_data [64];
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  if ((tls->key_schedule->hashes[0].algo)->digest_size + 4 == message.len) {
    local_6c = calc_verify_data(local_68,tls->key_schedule,&tls->traffic_protection);
    if ((local_6c == 0) &&
       (iVar1 = (*ptls_mem_equal)(message.base + 4,local_68,
                                  (tls->key_schedule->hashes[0].algo)->digest_size), iVar1 == 0)) {
      local_6c = 0x28;
    }
  }
  else {
    local_6c = 0x32;
  }
  (*ptls_clear_memory)(local_68,0x40);
  return local_6c;
}

Assistant:

static int verify_finished(ptls_t *tls, ptls_iovec_t message)
{
    uint8_t verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (PTLS_HANDSHAKE_HEADER_SIZE + tls->key_schedule->hashes[0].algo->digest_size != message.len) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    if ((ret = calc_verify_data(verify_data, tls->key_schedule, tls->traffic_protection.dec.secret)) != 0)
        goto Exit;
    if (!ptls_mem_equal(message.base + PTLS_HANDSHAKE_HEADER_SIZE, verify_data, tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }

Exit:
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}